

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
::alloc(array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
        *this,int new_len)

{
  CServerFilter *pCVar1;
  int in_ESI;
  CServerFilter *in_RDI;
  int i;
  int end;
  CServerFilter *new_list;
  int local_30;
  int local_2c;
  int iVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  (in_RDI->m_FilterInfo).m_SortHash = in_ESI;
  pCVar1 = allocator_default<CServerBrowserFilter::CServerFilter>::alloc_array(new_list._4_4_);
  if ((in_RDI->m_FilterInfo).m_Ping < (in_RDI->m_FilterInfo).m_SortHash) {
    local_2c = (in_RDI->m_FilterInfo).m_Ping;
  }
  else {
    local_2c = (in_RDI->m_FilterInfo).m_SortHash;
  }
  for (iVar2 = 0; iVar2 < local_2c; iVar2 = iVar2 + 1) {
    CServerBrowserFilter::CServerFilter::operator=((CServerFilter *)CONCAT44(local_2c,iVar2),in_RDI)
    ;
  }
  allocator_default<CServerBrowserFilter::CServerFilter>::free_array
            ((CServerFilter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if ((in_RDI->m_FilterInfo).m_Ping < (in_RDI->m_FilterInfo).m_SortHash) {
    local_30 = (in_RDI->m_FilterInfo).m_Ping;
  }
  else {
    local_30 = (in_RDI->m_FilterInfo).m_SortHash;
  }
  (in_RDI->m_FilterInfo).m_Ping = local_30;
  in_RDI->m_pServerBrowserFilter = (CServerBrowserFilter *)pCVar1;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}